

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HBondJump.cpp
# Opt level: O0

void __thiscall
OpenMD::HBondJumpR::HBondJumpR
          (HBondJumpR *this,SimInfo *info,string *filename,string *sele1,string *sele2,string *sele3
          ,RealType OOcut,RealType thetaCut,RealType OHcut,RealType len,int nRBins)

{
  bool bVar1;
  SelectionEvaluator *in_RDI;
  SelectionEvaluator *in_R9;
  SimInfo *in_XMM0_Qa;
  undefined8 in_XMM3_Qa;
  undefined4 in_stack_00000008;
  uint i;
  SimInfo *in_stack_00000178;
  SelectionManager *in_stack_00000180;
  double in_stack_00000428;
  double in_stack_00000430;
  double in_stack_00000438;
  string *in_stack_00000440;
  string *in_stack_00000448;
  string *in_stack_00000450;
  SimInfo *in_stack_00000458;
  HBondJump *in_stack_00000460;
  string *in_stack_fffffffffffffec8;
  undefined7 in_stack_fffffffffffffed0;
  undefined1 in_stack_fffffffffffffed7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *str;
  SelectionManager *this_00;
  pointer *__new_size;
  vector<double,_std::allocator<double>_> *this_01;
  allocator<char> *this_02;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_03;
  string *in_stack_ffffffffffffff18;
  SelectionEvaluator *in_stack_ffffffffffffff20;
  uint local_cc;
  string local_c8 [32];
  string local_a8 [39];
  undefined1 local_81 [49];
  undefined8 local_50;
  
  local_50 = in_XMM3_Qa;
  HBondJump::HBondJump
            (in_stack_00000460,in_stack_00000458,in_stack_00000450,in_stack_00000448,
             in_stack_00000440,in_stack_00000438,in_stack_00000430,in_stack_00000428);
  *(undefined ***)&(in_RDI->compiler).filename = &PTR__HBondJumpR_004e2a10;
  *(undefined8 *)((long)&in_RDI[3].filename.field_2 + 8) = local_50;
  *(undefined4 *)&in_RDI[3].script = in_stack_00000008;
  this_03 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            &in_RDI[3].script.field_2;
  SelectionManager::SelectionManager(in_stack_00000180,in_stack_00000178);
  this_02 = (allocator<char> *)&in_RDI[3].nameFinder.root_;
  std::__cxx11::string::string((string *)this_02,(string *)in_R9);
  SelectionEvaluator::SelectionEvaluator(in_R9,in_XMM0_Qa);
  str = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        &in_RDI[4].distanceFinder.stuntdoubles_.
         super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)0x15bfa1);
  this_00 = (SelectionManager *)
            &in_RDI[4].distanceFinder.bonds_.
             super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)0x15bfb7);
  __new_size = &in_RDI[4].distanceFinder.bends_.
                super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)0x15bfcd);
  this_01 = (vector<double,_std::allocator<double>_> *)local_81;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_03,(char *)in_RDI,this_02);
  TimeCorrFunc<double>::setCorrFuncType
            ((TimeCorrFunc<double> *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0),
             in_stack_fffffffffffffec8);
  std::__cxx11::string::~string((string *)(local_81 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_81);
  getPrefix(str);
  std::operator+(str,(char *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0));
  DynamicProperty::setOutputName
            ((DynamicProperty *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0),
             in_stack_fffffffffffffec8);
  std::__cxx11::string::~string(local_a8);
  std::__cxx11::string::~string(local_c8);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::resize((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)this_01,(size_type)__new_size);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::resize((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)this_01,(size_type)__new_size);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::resize((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)this_01,(size_type)__new_size);
  for (local_cc = 0; local_cc < *(uint *)((long)&(in_RDI->compiler).script.field_2 + 8);
      local_cc = local_cc + 1) {
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  *)&in_RDI[4].distanceFinder.stuntdoubles_.
                     super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish,(ulong)local_cc);
    std::vector<double,_std::allocator<double>_>::resize(this_01,(size_type)__new_size);
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  *)&in_RDI[4].distanceFinder.bonds_.
                     super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>._M_impl.
                     super__Vector_impl_data._M_finish,(ulong)local_cc);
    std::vector<int,_std::allocator<int>_>::resize
              ((vector<int,_std::allocator<int>_> *)this_01,(size_type)__new_size);
  }
  SelectionEvaluator::loadScriptString(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  bVar1 = SelectionEvaluator::isDynamic
                    ((SelectionEvaluator *)
                     &in_RDI[3].distanceFinder.stuntdoubles_.
                      super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish);
  if (!bVar1) {
    SelectionEvaluator::evaluate(in_RDI);
    SelectionManager::setSelectionSet(this_00,(SelectionSet *)str);
    SelectionSet::~SelectionSet((SelectionSet *)0x15c2cb);
  }
  in_RDI[3].script._M_string_length =
       (size_type)
       (*(double *)((long)&in_RDI[3].filename.field_2 + 8) / (double)*(uint *)&in_RDI[3].script);
  return;
}

Assistant:

HBondJumpR::HBondJumpR(SimInfo* info, const std::string& filename,
                         const std::string& sele1, const std::string& sele2,
                         const std::string& sele3, RealType OOcut,
                         RealType thetaCut, RealType OHcut, RealType len,
                         int nRBins) :
      HBondJump(info, filename, sele1, sele2, OOcut, thetaCut, OHcut),
      len_(len), nRBins_(nRBins), seleMan3_(info_), selectionScript3_(sele3),
      evaluator3_(info_) {
    setCorrFuncType("HBondJumpR");
    setOutputName(getPrefix(dumpFilename_) + ".jumpR");

    rbin_.resize(nFrames_);
    histogram_.resize(nTimeBins_);
    counts_.resize(nTimeBins_);
    for (unsigned int i = 0; i < nTimeBins_; i++) {
      histogram_[i].resize(nRBins_);
      counts_[i].resize(nRBins_);
    }

    evaluator3_.loadScriptString(selectionScript3_);
    if (!evaluator3_.isDynamic()) {
      seleMan3_.setSelectionSet(evaluator3_.evaluate());
    }

    deltaR_ = len_ / nRBins_;
  }